

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-htable.c
# Opt level: O1

ulong hash_func(char *param_1)

{
  ulong uVar1;
  byte *pbVar2;
  byte bVar3;
  
  pbVar2 = *(byte **)(param_1 + 8);
  bVar3 = *pbVar2;
  if (bVar3 != 0) {
    uVar1 = 0;
    do {
      pbVar2 = pbVar2 + 1;
      uVar1 = (ulong)(((uint)bVar3 ^ (uint)uVar1) * 0x1000193);
      bVar3 = *pbVar2;
    } while (bVar3 != 0);
    return uVar1;
  }
  return 0;
}

Assistant:

static uint32_t
hash_func(const HTABLE_NODE* node)
{
    /* FNV-1a */
    static const uint32_t FNV1A_PRIME_32 = 16777619;
    VAL* val = (VAL*) HTABLE_DATA(node, VAL, the_node);
    const uint8_t* ptr = (const uint8_t*) val->key;
    uint32_t fnv1a = 0;

    while(*ptr) {
        fnv1a ^= *ptr;
        fnv1a *= FNV1A_PRIME_32;
        ptr++;
    }

    return fnv1a;
}